

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_889438::TGlslangToSpvTraverser::translateArguments
          (TGlslangToSpvTraverser *this,TIntermAggregate *node,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *arguments,
          CoherentFlags *lvalueCoherentFlags)

{
  Id IVar1;
  bool bVar2;
  int iVar3;
  TOperator TVar4;
  Decoration decoration;
  CoherentFlags CVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar6;
  uint *puVar7;
  undefined4 extraout_var_01;
  size_type sVar8;
  const_reference ppTVar9;
  undefined4 extraout_var_02;
  TType *pTVar10;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar11;
  undefined4 extraout_var_06;
  long lVar12;
  reference __x;
  undefined4 extraout_var_07;
  bool local_ba;
  bool local_b9;
  Id local_ac;
  CoherentFlags local_a8;
  CoherentFlags local_a4;
  AccessChain local_a0;
  Id local_44;
  byte local_3d;
  Id lvalue_id;
  bool local_36;
  bool lvalue;
  int i;
  bool f16ShadowCompare;
  bool cubeCompare;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *pvStack_30;
  TSampler sampler;
  TIntermSequence *glslangArguments;
  CoherentFlags *lvalueCoherentFlags_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *arguments_local;
  TIntermAggregate *node_local;
  TGlslangToSpvTraverser *this_local;
  
  iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x33])();
  pvStack_30 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
               CONCAT44(extraout_var,iVar3);
  memset(&i,0,4);
  lvalue = false;
  local_36 = false;
  bVar2 = glslang::TIntermOperator::isTexture(&node->super_TIntermOperator);
  if ((bVar2) || (bVar2 = glslang::TIntermOperator::isImage(&node->super_TIntermOperator), bVar2)) {
    ppTVar9 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                        (pvStack_30,0);
    iVar3 = (*(*ppTVar9)->_vptr_TIntermNode[3])();
    plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0xf0))();
    puVar7 = (uint *)(**(code **)(*plVar6 + 0x40))();
    i = *puVar7;
    local_b9 = false;
    if ((((uint)i >> 8 & 0xff) == 4) && (local_b9 = false, ((uint)i >> 0x10 & 1) != 0)) {
      local_b9 = (bool)((byte)((uint)i >> 0x11) & 1);
    }
    lvalue = local_b9;
    local_ba = false;
    if (((uint)i >> 0x11 & 1) != 0) {
      ppTVar9 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                          (pvStack_30,1);
      iVar3 = (*(*ppTVar9)->_vptr_TIntermNode[3])();
      plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0xf0))();
      iVar3 = (**(code **)(*plVar6 + 0x38))();
      local_ba = iVar3 == 3;
    }
    local_36 = local_ba;
  }
  lvalue_id = 0;
  do {
    IVar1 = lvalue_id;
    sVar8 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(pvStack_30);
    if ((int)sVar8 <= (int)IVar1) {
      return;
    }
    spv::Builder::clearAccessChain(&this->builder);
    ppTVar9 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                        (pvStack_30,(long)(int)lvalue_id);
    (*(*ppTVar9)->_vptr_TIntermNode[2])(*ppTVar9,this);
    local_3d = 0;
    TVar4 = glslang::TIntermOperator::getOp(&node->super_TIntermOperator);
    switch(TVar4) {
    case EOpImageAtomicAdd:
    case EOpImageAtomicMin:
    case EOpImageAtomicMax:
    case EOpImageAtomicAnd:
    case EOpImageAtomicOr:
    case EOpImageAtomicXor:
    case EOpImageAtomicExchange:
    case EOpImageAtomicCompSwap:
    case EOpImageAtomicLoad:
    case EOpImageAtomicStore:
      if (lvalue_id == 0) {
        local_3d = 1;
      }
      break;
    default:
      break;
    case EOpSparseImageLoad:
      if (((((uint)i >> 0x12 & 1) != 0) && (lvalue_id == 3)) ||
         ((((uint)i >> 0x12 & 1) == 0 && (lvalue_id == 2)))) {
        local_3d = 1;
      }
      break;
    case EOpSparseImageLoadLod:
      if (lvalue_id == 3) {
        local_3d = 1;
      }
      break;
    case EOpSparseTexture:
      if (((((lvalue & 1U) != 0) || ((local_36 & 1U) != 0)) && (lvalue_id == 3)) ||
         ((((lvalue & 1U) == 0 && ((local_36 & 1U) == 0)) && (lvalue_id == 2)))) {
        local_3d = 1;
      }
      break;
    case EOpSparseTextureLod:
    case EOpSparseTextureOffset:
      if ((((local_36 & 1U) != 0) && (lvalue_id == 4)) ||
         (((local_36 & 1U) == 0 && (lvalue_id == 3)))) {
        local_3d = 1;
      }
      break;
    case EOpSparseTextureFetch:
      if (((((uint)i >> 8 & 0xff) != 5) && (lvalue_id == 3)) ||
         ((((uint)i >> 8 & 0xff) == 5 && (lvalue_id == 2)))) {
        local_3d = 1;
      }
      break;
    case EOpSparseTextureFetchOffset:
      if (((((uint)i >> 8 & 0xff) != 5) && (lvalue_id == 4)) ||
         ((((uint)i >> 8 & 0xff) == 5 && (lvalue_id == 3)))) {
        local_3d = 1;
      }
      break;
    case EOpSparseTextureLodOffset:
    case EOpSparseTextureGrad:
    case EOpSparseTextureOffsetClamp:
      if ((((local_36 & 1U) != 0) && (lvalue_id == 5)) ||
         (((local_36 & 1U) == 0 && (lvalue_id == 4)))) {
        local_3d = 1;
      }
      break;
    case EOpSparseTextureGradOffset:
    case EOpSparseTextureGradClamp:
      if ((((local_36 & 1U) != 0) && (lvalue_id == 6)) ||
         (((local_36 & 1U) == 0 && (lvalue_id == 5)))) {
        local_3d = 1;
      }
      break;
    case EOpSparseTextureGather:
      if (((((uint)i >> 0x11 & 1) != 0) && (lvalue_id == 3)) ||
         ((((uint)i >> 0x11 & 1) == 0 && (lvalue_id == 2)))) {
        local_3d = 1;
      }
      break;
    case EOpSparseTextureGatherOffset:
    case EOpSparseTextureGatherOffsets:
      if (((((uint)i >> 0x11 & 1) != 0) && (lvalue_id == 4)) ||
         ((((uint)i >> 0x11 & 1) == 0 && (lvalue_id == 3)))) {
        local_3d = 1;
      }
      break;
    case EOpSparseTextureClamp:
      if (((((lvalue & 1U) != 0) || ((local_36 & 1U) != 0)) && (lvalue_id == 4)) ||
         ((((lvalue & 1U) == 0 && ((local_36 & 1U) == 0)) && (lvalue_id == 3)))) {
        local_3d = 1;
      }
      break;
    case EOpSparseTextureGradOffsetClamp:
      if ((((local_36 & 1U) != 0) && (lvalue_id == 7)) ||
         (((local_36 & 1U) == 0 && (lvalue_id == 6)))) {
        local_3d = 1;
      }
      break;
    case EOpSparseTextureGatherLod:
      if (lvalue_id == 3) {
        local_3d = 1;
      }
      break;
    case EOpSparseTextureGatherLodOffset:
    case EOpSparseTextureGatherLodOffsets:
      if (lvalue_id == 4) {
        local_3d = 1;
      }
      break;
    case EOpImageSampleFootprintNV:
      if (lvalue_id == 4) {
        local_3d = 1;
      }
      break;
    case EOpImageSampleFootprintClampNV:
    case EOpImageSampleFootprintLodNV:
      if (lvalue_id == 5) {
        local_3d = 1;
      }
      break;
    case EOpImageSampleFootprintGradNV:
      if (lvalue_id == 6) {
        local_3d = 1;
      }
      break;
    case EOpImageSampleFootprintGradClampNV:
      if (lvalue_id == 7) {
        local_3d = 1;
      }
      break;
    case EOpRayQueryGetIntersectionTriangleVertexPositionsEXT:
    case EOpRayQueryGetIntersectionLSSPositionsNV:
    case EOpRayQueryGetIntersectionLSSRadiiNV:
      if (lvalue_id == 2) {
        local_3d = 1;
      }
    }
    if ((local_3d & 1) == 0) {
      if (0 < (int)lvalue_id) {
        ppTVar9 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                            (pvStack_30,(long)(int)lvalue_id);
        iVar3 = (*(*ppTVar9)->_vptr_TIntermNode[0xc])();
        if (CONCAT44(extraout_var_03,iVar3) != 0) {
          ppTVar9 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                              (pvStack_30,(long)(int)(lvalue_id - 1));
          iVar3 = (*(*ppTVar9)->_vptr_TIntermNode[0xc])();
          if (CONCAT44(extraout_var_04,iVar3) != 0) {
            ppTVar9 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                      operator[](pvStack_30,(long)(int)lvalue_id);
            iVar3 = (*(*ppTVar9)->_vptr_TIntermNode[0xc])();
            lVar11 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar3) + 0x180))();
            ppTVar9 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                      operator[](pvStack_30,(long)(int)(lvalue_id - 1));
            iVar3 = (*(*ppTVar9)->_vptr_TIntermNode[0xc])();
            lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar3) + 0x180))();
            if (lVar11 == lVar12) {
              __x = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (arguments,(long)(int)(lvalue_id - 1));
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(arguments,__x);
              goto LAB_005d2220;
            }
          }
        }
      }
      ppTVar9 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                          (pvStack_30,(long)(int)lvalue_id);
      iVar3 = (*(*ppTVar9)->_vptr_TIntermNode[3])();
      pTVar10 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_07,iVar3) + 0xf0))();
      local_ac = accessChainLoad(this,pTVar10);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(arguments,&local_ac);
    }
    else {
      local_44 = spv::Builder::accessChainGetLValue(&this->builder);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(arguments,&local_44);
      spv::Builder::getAccessChain(&local_a0,&this->builder);
      *(undefined2 *)lvalueCoherentFlags = local_a0.coherentFlags._0_2_;
      spv::Builder::AccessChain::~AccessChain(&local_a0);
      IVar1 = local_44;
      decoration = TranslateNonUniformDecoration(this,lvalueCoherentFlags);
      spv::Builder::addDecoration(&this->builder,IVar1,decoration,-1);
      ppTVar9 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                          (pvStack_30,(long)(int)lvalue_id);
      iVar3 = (*(*ppTVar9)->_vptr_TIntermNode[3])();
      pTVar10 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0xf0))();
      CVar5 = TranslateCoherent(this,pTVar10);
      local_a4._0_2_ = CVar5._0_2_;
      local_a8 = spv::Builder::AccessChain::CoherentFlags::operator|=(lvalueCoherentFlags,&local_a4)
      ;
    }
LAB_005d2220:
    lvalue_id = lvalue_id + 1;
  } while( true );
}

Assistant:

void TGlslangToSpvTraverser::translateArguments(const glslang::TIntermAggregate& node, std::vector<spv::Id>& arguments,
    spv::Builder::AccessChain::CoherentFlags &lvalueCoherentFlags)
{
    const glslang::TIntermSequence& glslangArguments = node.getSequence();

    glslang::TSampler sampler = {};
    bool cubeCompare = false;
    bool f16ShadowCompare = false;
    if (node.isTexture() || node.isImage()) {
        sampler = glslangArguments[0]->getAsTyped()->getType().getSampler();
        cubeCompare = sampler.dim == glslang::EsdCube && sampler.arrayed && sampler.shadow;
        f16ShadowCompare = sampler.shadow &&
            glslangArguments[1]->getAsTyped()->getType().getBasicType() == glslang::EbtFloat16;
    }

    for (int i = 0; i < (int)glslangArguments.size(); ++i) {
        builder.clearAccessChain();
        glslangArguments[i]->traverse(this);

        // Special case l-value operands
        bool lvalue = false;
        switch (node.getOp()) {
        case glslang::EOpImageAtomicAdd:
        case glslang::EOpImageAtomicMin:
        case glslang::EOpImageAtomicMax:
        case glslang::EOpImageAtomicAnd:
        case glslang::EOpImageAtomicOr:
        case glslang::EOpImageAtomicXor:
        case glslang::EOpImageAtomicExchange:
        case glslang::EOpImageAtomicCompSwap:
        case glslang::EOpImageAtomicLoad:
        case glslang::EOpImageAtomicStore:
            if (i == 0)
                lvalue = true;
            break;
        case glslang::EOpSparseImageLoad:
            if ((sampler.ms && i == 3) || (! sampler.ms && i == 2))
                lvalue = true;
            break;
        case glslang::EOpSparseTexture:
            if (((cubeCompare || f16ShadowCompare) && i == 3) || (! (cubeCompare || f16ShadowCompare) && i == 2))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureClamp:
            if (((cubeCompare || f16ShadowCompare) && i == 4) || (! (cubeCompare || f16ShadowCompare) && i == 3))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureLod:
        case glslang::EOpSparseTextureOffset:
            if  ((f16ShadowCompare && i == 4) || (! f16ShadowCompare && i == 3))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureFetch:
            if ((sampler.dim != glslang::EsdRect && i == 3) || (sampler.dim == glslang::EsdRect && i == 2))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureFetchOffset:
            if ((sampler.dim != glslang::EsdRect && i == 4) || (sampler.dim == glslang::EsdRect && i == 3))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureLodOffset:
        case glslang::EOpSparseTextureGrad:
        case glslang::EOpSparseTextureOffsetClamp:
            if ((f16ShadowCompare && i == 5) || (! f16ShadowCompare && i == 4))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureGradOffset:
        case glslang::EOpSparseTextureGradClamp:
            if ((f16ShadowCompare && i == 6) || (! f16ShadowCompare && i == 5))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureGradOffsetClamp:
            if ((f16ShadowCompare && i == 7) || (! f16ShadowCompare && i == 6))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureGather:
            if ((sampler.shadow && i == 3) || (! sampler.shadow && i == 2))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureGatherOffset:
        case glslang::EOpSparseTextureGatherOffsets:
            if ((sampler.shadow && i == 4) || (! sampler.shadow && i == 3))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureGatherLod:
            if (i == 3)
                lvalue = true;
            break;
        case glslang::EOpSparseTextureGatherLodOffset:
        case glslang::EOpSparseTextureGatherLodOffsets:
            if (i == 4)
                lvalue = true;
            break;
        case glslang::EOpSparseImageLoadLod:
            if (i == 3)
                lvalue = true;
            break;
        case glslang::EOpImageSampleFootprintNV:
            if (i == 4)
                lvalue = true;
            break;
        case glslang::EOpImageSampleFootprintClampNV:
        case glslang::EOpImageSampleFootprintLodNV:
            if (i == 5)
                lvalue = true;
            break;
        case glslang::EOpImageSampleFootprintGradNV:
            if (i == 6)
                lvalue = true;
            break;
        case glslang::EOpImageSampleFootprintGradClampNV:
            if (i == 7)
                lvalue = true;
            break;
        case glslang::EOpRayQueryGetIntersectionTriangleVertexPositionsEXT:
        case glslang::EOpRayQueryGetIntersectionLSSPositionsNV:
        case glslang::EOpRayQueryGetIntersectionLSSRadiiNV:
            if (i == 2)
                lvalue = true;
            break;
        default:
            break;
        }

        if (lvalue) {
            spv::Id lvalue_id = builder.accessChainGetLValue();
            arguments.push_back(lvalue_id);
            lvalueCoherentFlags = builder.getAccessChain().coherentFlags;
            builder.addDecoration(lvalue_id, TranslateNonUniformDecoration(lvalueCoherentFlags));
            lvalueCoherentFlags |= TranslateCoherent(glslangArguments[i]->getAsTyped()->getType());
        } else {
            if (i > 0 &&
                glslangArguments[i]->getAsSymbolNode() && glslangArguments[i-1]->getAsSymbolNode() &&
                glslangArguments[i]->getAsSymbolNode()->getId() == glslangArguments[i-1]->getAsSymbolNode()->getId()) {
                // Reuse the id if possible
                arguments.push_back(arguments[i-1]);
            } else {
                arguments.push_back(accessChainLoad(glslangArguments[i]->getAsTyped()->getType()));
            }
        }
    }
}